

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_error_handler(_func_void_string_ptr *handler)

{
  err_handler *in_stack_00000028;
  registry *in_stack_00000030;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **in_stack_ffffffffffffffc8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffd0;
  
  details::registry::instance();
  std::function<void(std::__cxx11::string_const&)>::
  function<void(*&)(std::__cxx11::string_const&),void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  details::registry::set_error_handler(in_stack_00000030,in_stack_00000028);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x5fb3d0);
  return;
}

Assistant:

SPDLOG_INLINE void set_error_handler(void (*handler)(const std::string &msg)) {
    details::registry::instance().set_error_handler(handler);
}